

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

int32_t helicsDataBufferFillFromInteger(HelicsDataBuffer data,int64_t value)

{
  Message *pMVar1;
  int32_t iVar2;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar1->data;
    if (pMVar1 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  iVar2 = 0;
  if ((SmallBuffer *)data != (SmallBuffer *)0x0) {
    helics::SmallBuffer::reserve((SmallBuffer *)data,0x10);
    ((SmallBuffer *)data)->bufferSize = 0x10;
    helics::detail::convertToBinary(((SmallBuffer *)data)->heap,value);
    iVar2 = (int32_t)((SmallBuffer *)data)->bufferSize;
  }
  return iVar2;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromInteger(HelicsDataBuffer data, int64_t value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<int64_t>::convert(value, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}